

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt_limits.c
# Opt level: O2

int main(void)

{
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  uchar *p;
  uint *puVar4;
  size_t sVar5;
  ulong extraout_RDX;
  long lVar6;
  char *pcVar7;
  long lVar8;
  size_t sVar9;
  ulong uVar10;
  void *buf;
  byte bVar11;
  uchar *puVar12;
  undefined8 uStack_98;
  char *pcStack_90;
  undefined8 local_58;
  size_t psbt_len;
  uchar *local_48;
  long local_40;
  size_t written;
  
  iVar3 = getpagesize();
  sVar9 = (size_t)iVar3;
  p = (uchar *)mmap((void *)0x0,sVar9 * 2,3,0x22,-1,0);
  if (p == (uchar *)0xffffffffffffffff) {
    puVar4 = (uint *)__errno_location();
    uVar1 = *puVar4;
    pcStack_90 = "Failed to mmap anon, errno %d";
  }
  else {
    local_48 = p + sVar9;
    iVar3 = munmap(local_48,sVar9);
    if (iVar3 == 0) {
      for (lVar6 = 0; lVar6 != 0x1a0; lVar6 = lVar6 + 0x10) {
        test_psbt_read((psbt_test *)((long)&invalid_psbts[0].hex + lVar6),p,sVar9);
      }
      lVar6 = 0;
      while( true ) {
        if (lVar6 == 10) {
          wally_cleanup(0);
          return 0;
        }
        local_40 = lVar6;
        test_psbt_read(valid_psbts + lVar6,p,sVar9);
        pcVar7 = valid_psbts[lVar6].base64;
        iVar3 = wally_psbt_from_base64(pcVar7,&local_58);
        if (iVar3 != 0) break;
        iVar3 = wally_psbt_get_length(local_58,0,&psbt_len);
        if (iVar3 != 0) break;
        sVar5 = psbt_len;
        puVar12 = local_48;
        for (uVar10 = 0; uVar10 <= sVar5; uVar10 = uVar10 + 1) {
          iVar3 = wally_psbt_to_bytes(local_58,0,puVar12,uVar10,&written);
          if (iVar3 != 0) {
LAB_00102374:
            fail("wally_psbt_to_bytes %s should have succeeded",pcVar7);
            goto LAB_00102385;
          }
          if (written != psbt_len) {
            fail("wally_psbt_to_bytes %s wrote %zu in %zu bytes?",pcVar7,written,uVar10);
            goto LAB_00102374;
          }
          puVar12 = puVar12 + -1;
          sVar5 = written;
        }
        wally_psbt_free();
        lVar6 = local_40 + 1;
      }
LAB_00102385:
      abort();
    }
    puVar4 = (uint *)__errno_location();
    uVar1 = *puVar4;
    pcStack_90 = "Failed to munmap /dev/zero, errno %d";
  }
  uVar10 = (ulong)uVar1;
  fail(pcStack_90);
  pcVar7 = *(char **)pcStack_90;
  sVar9 = strlen(pcVar7);
  if (extraout_RDX < sVar9 >> 1) {
    __assert_fail("hex_data_size(strlen(test->hex)) <= plen",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/libwally-core/src/ctest/test_psbt_limits.c"
                  ,0x50,"void test_psbt_read(const struct psbt_test *, unsigned char *, size_t)");
  }
  lVar6 = uVar10 + extraout_RDX;
  uVar10 = 0;
  while( true ) {
    sVar9 = strlen(pcVar7);
    if (sVar9 >> 1 < uVar10) {
      return (int)(sVar9 >> 1);
    }
    buf = (void *)(lVar6 - uVar10);
    _Var2 = hex_decode(pcVar7,uVar10 * 2,buf,uVar10);
    if (!_Var2) break;
    iVar3 = wally_psbt_from_bytes(buf,uVar10,&uStack_98);
    if (iVar3 == 0) {
      wally_psbt_free(uStack_98);
    }
    for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
      bVar11 = (byte)(1 << ((byte)lVar8 & 0x1f));
      *(byte *)(lVar6 + -1) = *(byte *)(lVar6 + -1) ^ bVar11;
      iVar3 = wally_psbt_from_bytes(buf,uVar10,&uStack_98);
      if (iVar3 == 0) {
        wally_psbt_free(uStack_98);
      }
      *(byte *)(lVar6 + -1) = *(byte *)(lVar6 + -1) ^ bVar11;
    }
    uVar10 = uVar10 + 1;
    pcVar7 = *(char **)pcStack_90;
  }
  abort();
}

Assistant:

int main(void)
{
    size_t i;
    size_t plen;
    unsigned char *p = cliff(&plen);

    for (i = 0; i < sizeof(invalid_psbts) / sizeof(invalid_psbts[0]); i++) {
        test_psbt_read(invalid_psbts + i, p, plen);
    }

    for (i = 0; i < sizeof(valid_psbts) / sizeof(valid_psbts[0]); i++) {
        test_psbt_read(valid_psbts + i, p, plen);
        test_psbt_write(valid_psbts + i, p, plen);
    }

    wally_cleanup(0);
    return 0;
}